

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall HdlcAnalyzerResults::GenAbortFieldString(HdlcAnalyzerResults *this,bool tabular)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  
  pcVar1 = "(0x7D-0x7F)";
  if (this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    pcVar1 = "(>=7 1-bits)";
  }
  if ((int)CONCAT71(in_register_00000031,tabular) == 0) {
    AnalyzerResults::AddResultString
              ((char *)this,"AB!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ABORT!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ABORT SEQUENCE!",pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    AnalyzerResults::AddTabularText
              ((char *)this,"ABORT SEQUENCE!",pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenAbortFieldString( bool tabular )
{
    char* seq = 0;
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        seq = "(>=7 1-bits)";
    }
    else
    {
        seq = "(0x7D-0x7F)";
    }

    if( !tabular )
    {
        AddResultString( "AB!" );
        AddResultString( "ABORT!" );
        AddResultString( "ABORT SEQUENCE!", seq );
    }
    else
    {
        AddTabularText( "ABORT SEQUENCE!", seq );
    }
}